

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O0

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,MethodInvocation *method_invocation)

{
  NewScopeLayer *pNVar1;
  NewScopeLayerTree *tree;
  bool bVar2;
  uint uVar3;
  int index_00;
  ostream *poVar4;
  mapped_type *pmVar5;
  element_type *peVar6;
  element_type *peVar7;
  runtime_error *prVar8;
  ClassStorage *this_00;
  vector<Expression_*,_std::allocator<Expression_*>_> *this_01;
  reference ppEVar9;
  mapped_type *pmVar10;
  Value *pVVar11;
  mapped_type *ppNVar12;
  FrameEmulator *this_02;
  element_type *peVar13;
  VariableValue *local_630;
  string local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  Symbol local_510;
  undefined1 local_4f0 [8];
  NewFunctionProcessingVisitor new_visitor;
  Symbol local_328;
  int local_304;
  VariableValue *pVStack_300;
  int index;
  VariableValue *class_obj;
  Symbol local_2d8;
  undefined1 local_2b8 [8];
  mapped_type method;
  Expression **expr;
  iterator __end2;
  iterator __begin2;
  vector<Expression_*,_std::allocator<Expression_*>_> *__range2;
  vector<Value_*,_std::allocator<Value_*>_> parameters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  _Node_iterator_base<std::pair<const_Symbol,_std::shared_ptr<Method>_>,_true> local_200;
  string local_1f8;
  Symbol local_1d8;
  _Node_iterator_base<std::pair<const_Symbol,_std::shared_ptr<Method>_>,_true> local_1b8;
  undefined1 local_1b0 [8];
  unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>
  methods;
  Symbol local_158;
  undefined1 local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [8];
  shared_ptr<PrimitiveSimpleObject> casted_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  Symbol local_b8;
  undefined1 local_98 [8];
  mapped_type variable;
  Symbol local_68;
  undefined1 local_38 [8];
  Symbol class_symbol;
  MethodInvocation *method_invocation_local;
  NewFunctionProcessingVisitor *this_local;
  
  class_symbol.name_.field_2._8_8_ = method_invocation;
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)&method_invocation->method_name_);
  poVar4 = std::operator<<(poVar4," called!");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Symbol::Symbol((Symbol *)local_38);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (class_symbol.name_.field_2._8_8_ + 0x10),"this");
  if (bVar2) {
    Symbol::operator=((Symbol *)local_38,&this->current_layer_->class_symbol_);
  }
  else {
    pNVar1 = this->current_layer_;
    std::__cxx11::string::string
              ((string *)
               &variable.super___shared_ptr<PrimitiveObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,(string *)(class_symbol.name_.field_2._8_8_ + 0x10));
    Symbol::Symbol(&local_68,
                   (string *)
                   &variable.super___shared_ptr<PrimitiveObject,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
    bVar2 = NewScopeLayer::HasVariable(pNVar1,&local_68);
    Symbol::~Symbol(&local_68);
    std::__cxx11::string::~string
              ((string *)
               &variable.super___shared_ptr<PrimitiveObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"Can\'t call methods from undeclared variable");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pNVar1 = this->current_layer_;
    std::__cxx11::string::string
              ((string *)&local_d8,(string *)(class_symbol.name_.field_2._8_8_ + 0x10));
    Symbol::Symbol(&local_b8,&local_d8);
    pmVar5 = std::
             unordered_map<Symbol,_std::shared_ptr<PrimitiveObject>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>_>
             ::operator[](&pNVar1->variables_,&local_b8);
    std::shared_ptr<PrimitiveObject>::shared_ptr((shared_ptr<PrimitiveObject> *)local_98,pmVar5);
    Symbol::~Symbol(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    peVar6 = std::__shared_ptr_access<PrimitiveObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PrimitiveObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_98);
    uVar3 = (*(peVar6->super_Object)._vptr_Object[4])();
    if ((uVar3 & 1) != 0) {
      casted_var.super___shared_ptr<PrimitiveSimpleObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._7_1_ = 1;
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_f8,"Can\'t call methods from array object: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (class_symbol.name_.field_2._8_8_ + 0x10));
      std::runtime_error::runtime_error(prVar8,(string *)&local_f8);
      casted_var.super___shared_ptr<PrimitiveSimpleObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._7_1_ = 0;
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::dynamic_pointer_cast<PrimitiveSimpleObject,PrimitiveObject>
              ((shared_ptr<PrimitiveObject> *)local_110);
    peVar7 = std::
             __shared_ptr_access<PrimitiveSimpleObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PrimitiveSimpleObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_110);
    bVar2 = PrimitiveSimpleObject::IsClass(peVar7);
    if (!bVar2) {
      local_131 = 1;
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_130,"Can\'t call methods from non-class object: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (class_symbol.name_.field_2._8_8_ + 0x10));
      std::runtime_error::runtime_error(prVar8,(string *)&local_130);
      local_131 = 0;
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar7 = std::
             __shared_ptr_access<PrimitiveSimpleObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PrimitiveSimpleObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_110);
    (**(peVar7->super_PrimitiveObject).super_Object._vptr_Object)(&methods._M_h._M_single_bucket);
    Symbol::Symbol(&local_158,(string *)&methods._M_h._M_single_bucket);
    Symbol::operator=((Symbol *)local_38,&local_158);
    Symbol::~Symbol(&local_158);
    std::__cxx11::string::~string((string *)&methods._M_h._M_single_bucket);
    std::shared_ptr<PrimitiveSimpleObject>::~shared_ptr
              ((shared_ptr<PrimitiveSimpleObject> *)local_110);
    std::shared_ptr<PrimitiveObject>::~shared_ptr((shared_ptr<PrimitiveObject> *)local_98);
  }
  this_00 = ClassStorage::GetInstance();
  ClassStorage::GetMethods
            ((unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>
              *)local_1b0,this_00,(Symbol *)local_38);
  std::__cxx11::string::string
            ((string *)&local_1f8,(string *)(class_symbol.name_.field_2._8_8_ + 0x30));
  Symbol::Symbol(&local_1d8,&local_1f8);
  local_1b8._M_cur =
       (__node_type *)
       std::
       unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>
       ::find((unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>
               *)local_1b0,&local_1d8);
  local_200._M_cur =
       (__node_type *)
       std::
       unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>
       ::end((unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>
              *)local_1b0);
  bVar2 = std::__detail::operator==(&local_1b8,&local_200);
  Symbol::~Symbol(&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  if (bVar2) {
    parameters.super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage._7_1_ = 1;
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_260,"Can\'t call ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (class_symbol.name_.field_2._8_8_ + 0x30));
    std::operator+(&local_240,&local_260," from ");
    std::operator+(&local_220,&local_240,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (class_symbol.name_.field_2._8_8_ + 0x10));
    std::runtime_error::runtime_error(prVar8,(string *)&local_220);
    parameters.super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage._7_1_ = 0;
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<Value_*,_std::allocator<Value_*>_>::vector
            ((vector<Value_*,_std::allocator<Value_*>_> *)&__range2);
  if (*(long *)(class_symbol.name_.field_2._8_8_ + 0x50) != 0) {
    this_01 = (vector<Expression_*,_std::allocator<Expression_*>_> *)
              (*(long *)(class_symbol.name_.field_2._8_8_ + 0x50) + 8);
    __end2 = std::vector<Expression_*,_std::allocator<Expression_*>_>::begin(this_01);
    expr = (Expression **)std::vector<Expression_*,_std::allocator<Expression_*>_>::end(this_01);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Expression_**,_std::vector<Expression_*,_std::allocator<Expression_*>_>_>
                                       *)&expr), bVar2) {
      ppEVar9 = __gnu_cxx::
                __normal_iterator<Expression_**,_std::vector<Expression_*,_std::allocator<Expression_*>_>_>
                ::operator*(&__end2);
      method.super___shared_ptr<Method,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           TemplateVisitor<Value_*>::Accept
                     (&this->super_TemplateVisitor<Value_*>,&(*ppEVar9)->super_Node);
      std::vector<Value*,std::allocator<Value*>>::emplace_back<Value*>
                ((vector<Value*,std::allocator<Value*>> *)&__range2,
                 (Value **)
                 &method.super___shared_ptr<Method,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      __gnu_cxx::
      __normal_iterator<Expression_**,_std::vector<Expression_*,_std::allocator<Expression_*>_>_>::
      operator++(&__end2);
    }
  }
  std::__cxx11::string::string
            ((string *)&class_obj,(string *)(class_symbol.name_.field_2._8_8_ + 0x30));
  Symbol::Symbol(&local_2d8,(string *)&class_obj);
  pmVar10 = std::
            unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>
            ::operator[]((unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>
                          *)local_1b0,&local_2d8);
  std::shared_ptr<Method>::shared_ptr((shared_ptr<Method> *)local_2b8,pmVar10);
  Symbol::~Symbol(&local_2d8);
  std::__cxx11::string::~string((string *)&class_obj);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (class_symbol.name_.field_2._8_8_ + 0x10),"this");
  if (bVar2) {
    pVStack_300 = this->this_;
  }
  else {
    std::__cxx11::string::string
              ((string *)
               &new_visitor.offsets_.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node,
               (string *)(class_symbol.name_.field_2._8_8_ + 0x10));
    Symbol::Symbol(&local_328,
                   (string *)
                   &new_visitor.offsets_.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node);
    index_00 = FunctionTable::Get(&this->table_,&local_328);
    Symbol::~Symbol(&local_328);
    std::__cxx11::string::~string
              ((string *)
               &new_visitor.offsets_.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node);
    local_304 = index_00;
    pVVar11 = FrameEmulator::Get(&this->frame_,index_00);
    if (pVVar11 == (Value *)0x0) {
      local_630 = (VariableValue *)0x0;
    }
    else {
      local_630 = (VariableValue *)
                  __dynamic_cast(pVVar11,&Value::typeinfo,&VariableValue::typeinfo,0);
    }
    pVStack_300 = local_630;
  }
  tree = this->tree_;
  Symbol::GetName_abi_cxx11_(&local_570,(Symbol *)local_38);
  std::operator+(&local_550,&local_570,"$");
  std::operator+(&local_530,&local_550,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (class_symbol.name_.field_2._8_8_ + 0x30));
  Symbol::Symbol(&local_510,&local_530);
  ppNVar12 = std::
             unordered_map<Symbol,_NewScopeLayer_*,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_NewScopeLayer_*>_>_>
             ::operator[](&tree->layer_mapping_,&local_510);
  NewFunctionProcessingVisitor
            ((NewFunctionProcessingVisitor *)local_4f0,tree,*ppNVar12,
             (shared_ptr<Method> *)local_2b8,pVStack_300);
  Symbol::~Symbol(&local_510);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_570);
  SetParameters((NewFunctionProcessingVisitor *)local_4f0,
                (vector<Value_*,_std::allocator<Value_*>_> *)&__range2);
  this_02 = GetFrame((NewFunctionProcessingVisitor *)local_4f0);
  FrameEmulator::SetParentFrame(this_02,&this->frame_);
  peVar13 = std::__shared_ptr_access<Method,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Method,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_2b8);
  Visit((NewFunctionProcessingVisitor *)local_4f0,peVar13->method_declaration_);
  pVVar11 = FrameEmulator::GetReturnValue(&this->frame_);
  (this->super_TemplateVisitor<Value_*>).tos_value_ = pVVar11;
  ~NewFunctionProcessingVisitor((NewFunctionProcessingVisitor *)local_4f0);
  std::shared_ptr<Method>::~shared_ptr((shared_ptr<Method> *)local_2b8);
  std::vector<Value_*,_std::allocator<Value_*>_>::~vector
            ((vector<Value_*,_std::allocator<Value_*>_> *)&__range2);
  std::
  unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>
  ::~unordered_map((unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>
                    *)local_1b0);
  Symbol::~Symbol((Symbol *)local_38);
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(MethodInvocation* method_invocation) {
  std::cout << method_invocation->method_name_ << " called!" << std::endl;

  Symbol class_symbol;
  if (method_invocation->call_from_ == "this") {
    class_symbol = current_layer_->class_symbol_;
  } else {
    if (!current_layer_->HasVariable(Symbol(method_invocation->call_from_))) {
      throw std::runtime_error("Can't call methods from undeclared variable");
    }

    auto variable =
        current_layer_->variables_[Symbol(method_invocation->call_from_)];
    if (variable->IsArray()) {
      throw std::runtime_error("Can't call methods from array object: " +
                               method_invocation->call_from_);
    }

    auto casted_var =
        std::dynamic_pointer_cast<PrimitiveSimpleObject>(variable);
    if (!casted_var->IsClass()) {
      throw std::runtime_error("Can't call methods from non-class object: " +
                               method_invocation->call_from_);
    }

    class_symbol = Symbol(casted_var->GetTypename());
  }

  auto methods = ClassStorage::GetInstance().GetMethods(class_symbol);
  if (methods.find(Symbol(method_invocation->method_name_)) == methods.end()) {
    throw std::runtime_error("Can't call " + method_invocation->method_name_ +
                             " from " + method_invocation->call_from_);
  }

  std::vector<Value*> parameters;
  if (method_invocation->arguments_list_) {
    for (auto&& expr :
         method_invocation->arguments_list_->list_of_expressions_) {
      parameters.emplace_back(Accept(expr));
    }
  }

  auto method = methods[Symbol(method_invocation->method_name_)];

  VariableValue* class_obj;
  if (method_invocation->call_from_ == "this") {
    class_obj = this_;
  } else {
    int index = table_.Get(Symbol(method_invocation->call_from_));
    class_obj = dynamic_cast<VariableValue*>(frame_.Get(index));
  }

  NewFunctionProcessingVisitor new_visitor(
      tree_,
      tree_->layer_mapping_[Symbol(class_symbol.GetName() + "$" +
                                   method_invocation->method_name_)],
      method, class_obj);

  new_visitor.SetParameters(parameters);
  new_visitor.GetFrame().SetParentFrame(&frame_);
  new_visitor.Visit(method->method_declaration_);
  tos_value_ = frame_.GetReturnValue();
}